

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

SizedPtr __thiscall
google::protobuf::internal::SerialArena::
Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
          (SerialArena *this,GetDeallocator deallocator)

{
  _func_void_void_ptr_size_t *p_Var1;
  SizedPtr mem_00;
  SizedPtr SVar2;
  ArenaBlock *b;
  SerialArena *this_local;
  GetDeallocator deallocator_local;
  SizedPtr mem;
  
  this_local = (SerialArena *)deallocator.dealloc_;
  FreeStringBlocks(this);
  deallocator_local.dealloc_ = (_func_void_void_ptr_size_t *)head(this);
  mem.p = (void *)((ArenaBlock *)deallocator_local.dealloc_)->size;
  while (*(long *)deallocator_local.dealloc_ != 0) {
    p_Var1 = *deallocator_local.dealloc_;
    mem_00.n = (size_t)mem.p;
    mem_00.p = deallocator_local.dealloc_;
    anon_unknown_12::GetDeallocator::operator()((GetDeallocator *)&this_local,mem_00);
    mem.p = *(void **)(p_Var1 + 8);
    deallocator_local.dealloc_ = p_Var1;
  }
  SVar2.n = (size_t)mem.p;
  SVar2.p = deallocator_local.dealloc_;
  return SVar2;
}

Assistant:

SizedPtr SerialArena::Free(Deallocator deallocator) {
  FreeStringBlocks();

  ArenaBlock* b = head();
  SizedPtr mem = {b, b->size};
  while (b->next) {
    b = b->next;  // We must first advance before deleting this block
    deallocator(mem);
    mem = {b, b->size};
  }
  return mem;
}